

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O0

Vertices_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
vertices_iterator_end
          (Vertices_iterator *__return_storage_ptr__,
          Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  reference rVar7;
  reference local_38;
  ulong local_28;
  size_t i;
  Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *local_18;
  Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this_local;
  Vertices_iterator *a;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = (Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *)
               __return_storage_ptr__;
  Vertices_iterator::Vertices_iterator(__return_storage_ptr__,this);
  local_28 = 0;
  while( true ) {
    uVar2 = local_28;
    uVar4 = Bitmap_cubical_complex_base<double>::dimension
                      (&this->super_Bitmap_cubical_complex_base<double>);
    if (uVar2 == uVar4) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->super_Bitmap_cubical_complex_base<double>).sizes,local_28);
    vVar1 = *pvVar5;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->directions_in_which_periodic_b_cond_are_to_be_imposed,local_28);
    local_38 = rVar7;
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&__return_storage_ptr__->counter,local_28);
    *pvVar6 = (ulong)(vVar1 - bVar3);
    local_28 = local_28 + 1;
  }
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&__return_storage_ptr__->counter,0);
  *pvVar6 = *pvVar6 + 1;
  return __return_storage_ptr__;
}

Assistant:

Vertices_iterator vertices_iterator_end() {
    Vertices_iterator a(this);
    for (std::size_t i = 0; i != this->dimension(); ++i) {
      a.counter[i] = this->sizes[i] - this->directions_in_which_periodic_b_cond_are_to_be_imposed[i];
    }
    a.counter[0]++;
    return a;
  }